

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O3

FPolyObj * __thiscall FPolyMirrorIterator::NextMirror(FPolyMirrorIterator *this)

{
  uint uVar1;
  uint uVar2;
  FPolyObj *pFVar3;
  long lVar4;
  FPolyObj *pFVar5;
  
  pFVar3 = this->CurPoly;
  if (pFVar3 == (FPolyObj *)0x0) {
    return (FPolyObj *)0x0;
  }
  uVar1 = pFVar3->MirrorNum;
  if (uVar1 == 0) {
LAB_0046f20b:
    pFVar5 = (FPolyObj *)0x0;
  }
  else {
    uVar2 = this->NumUsedPolys;
    pFVar5 = (FPolyObj *)0x0;
    if ((FPolyObj *)(ulong)uVar2 == (FPolyObj *)0x64) goto LAB_0046f20e;
    if ((int)uVar2 < 1) {
LAB_0046f1b2:
      if ((uint)pFVar5 != uVar2) goto LAB_0046f20b;
    }
    else {
      pFVar5 = (FPolyObj *)0x0;
      do {
        if (this->UsedPolys[(long)pFVar5] == uVar1) goto LAB_0046f1b2;
        pFVar5 = (FPolyObj *)((long)&(pFVar5->Sidedefs).Array + 1);
      } while ((FPolyObj *)(ulong)uVar2 != pFVar5);
    }
    this->NumUsedPolys = uVar2 + 1;
    this->UsedPolys[(int)uVar2] = uVar1;
    lVar4 = (long)po_NumPolyobjs;
    pFVar5 = polyobjs;
    if (0 < lVar4) {
      do {
        if (pFVar5->tag == uVar1) goto LAB_0046f20e;
        lVar4 = lVar4 + -1;
        pFVar5 = pFVar5 + 1;
      } while (lVar4 != 0);
    }
    pFVar5 = (FPolyObj *)0x0;
    Printf("Invalid mirror polyobj num %d for polyobj num %d\n",(ulong)uVar1,
           (ulong)(uint)this->UsedPolys[(long)(int)uVar2 + -1]);
  }
LAB_0046f20e:
  this->CurPoly = pFVar5;
  return pFVar3;
}

Assistant:

FPolyObj *FPolyMirrorIterator::NextMirror()
{
	FPolyObj *poly = CurPoly, *nextpoly;

	if (poly == NULL)
	{
		return NULL;
	}

	// Do the work to decide which polyobject to return the next time this
	// function is called.
	int mirror = poly->GetMirror(), i;
	nextpoly = NULL;

	// Is there a mirror and we have room to remember it?
	if (mirror != 0 && NumUsedPolys != countof(UsedPolys))
	{
		// Has this polyobject been returned already?
		for (i = 0; i < NumUsedPolys; ++i)
		{
			if (UsedPolys[i] == mirror)
			{
				break;	// Yes, it has been returned.
			}
		}
		if (i == NumUsedPolys)
		{ // No, it has not been returned.
			UsedPolys[NumUsedPolys++] = mirror;
			nextpoly = PO_GetPolyobj(mirror);
			if (nextpoly == NULL)
			{
				Printf("Invalid mirror polyobj num %d for polyobj num %d\n", mirror, UsedPolys[i - 1]);
			}
		}
	}
	CurPoly = nextpoly;
	return poly;
}